

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

Node * prvTidyParseNoFrames(TidyDocImpl *doc,Node *noframes,GetTokenMode mode)

{
  Lexer *pLVar1;
  Dict *pDVar2;
  Node *pNVar3;
  TidyParserMemory data;
  Bool BVar4;
  Node *pNVar5;
  Node *pNVar6;
  Node **ppNVar7;
  bool bVar8;
  Node *local_70;
  TidyParserMemory memory;
  
  pLVar1 = doc->lexer;
  if (noframes == (Node *)0x0) {
    prvTidypopMemory(doc);
    local_70 = memory.original_node;
    bVar8 = memory.register_1 == 0;
  }
  else {
    bVar8 = true;
    if ((doc->config).value[1].v == 0) {
      *(byte *)&doc->badAccess = (byte)doc->badAccess | 0x20;
    }
    memory.reentry_node = (Node *)0x0;
    memory.reentry_state = 0;
    local_70 = noframes;
  }
LAB_0013a988:
  do {
    do {
      while (memory.reentry_state == 1) {
        memory.reentry_state = 0;
        if ((!bVar8) && (pNVar5 = prvTidyFindBody(doc), pNVar5 != memory.reentry_node)) {
          prvTidyCoerceNode(doc,memory.reentry_node,TidyTag_DIV,no,no);
          pNVar5 = prvTidyFindBody(doc);
          memory.reentry_state = 0;
          if (pNVar5 != (Node *)0x0) {
            prvTidyRemoveNode(memory.reentry_node);
            (memory.reentry_node)->parent = pNVar5;
            pNVar6 = pNVar5->last;
            (memory.reentry_node)->prev = pNVar6;
            ppNVar7 = &pNVar5->content;
            if (pNVar6 != (Node *)0x0) {
              ppNVar7 = &pNVar6->next;
            }
            *ppNVar7 = memory.reentry_node;
            pNVar5->last = memory.reentry_node;
            memory.reentry_state = 0;
          }
        }
      }
      if (memory.reentry_state == 2) {
        prvTidyReport(doc,local_70,memory.reentry_node,0x25a);
        return (Node *)0x0;
      }
    } while (memory.reentry_state != 0);
    pNVar5 = prvTidyGetToken(doc,IgnoreWhitespace);
    memory.reentry_state = 2;
    memory.reentry_node = (Node *)0x0;
  } while (pNVar5 == (Node *)0x0);
  pDVar2 = pNVar5->tag;
  if ((pDVar2 == local_70->tag) && (pNVar5->type == EndTag)) {
    prvTidyFreeNode(doc,pNVar5);
    local_70->closed = yes;
    TrimSpaces(doc,local_70);
    return (Node *)0x0;
  }
  memory.reentry_node = pNVar5;
  if (pDVar2 == (Dict *)0x0) goto LAB_0013aa59;
  if (pDVar2->id != TidyTag_HTML) {
    if (pDVar2->id - TidyTag_FRAME < 2) {
      TrimSpaces(doc,local_70);
      if (pNVar5->type == EndTag) {
        prvTidyReport(doc,local_70,pNVar5,0x235);
        prvTidyFreeNode(doc,pNVar5);
        return (Node *)0x0;
      }
      prvTidyReport(doc,local_70,pNVar5,0x259);
      prvTidyUngetToken(doc);
      return (Node *)0x0;
    }
    goto LAB_0013aa59;
  }
  BVar4 = prvTidynodeIsElement(pNVar5);
  if (BVar4 != no) goto LAB_0013aac6;
  goto LAB_0013aadb;
LAB_0013aa59:
  BVar4 = InsertMisc(local_70,pNVar5);
  memory.reentry_state = 0;
  if (BVar4 != no) goto LAB_0013a988;
  if (((pNVar5->tag == (Dict *)0x0) || (pNVar5->tag->id != TidyTag_BODY)) ||
     (pNVar5->type != StartTag)) {
    BVar4 = prvTidynodeIsText(pNVar5);
    if ((BVar4 == no) && ((pNVar5->tag == (Dict *)0x0 || (pNVar5->type == EndTag)))) {
LAB_0013aac6:
      prvTidyReport(doc,local_70,pNVar5,0x235);
LAB_0013aadb:
      prvTidyFreeNode(doc,pNVar5);
      memory.reentry_state = 0;
      goto LAB_0013a988;
    }
    pNVar6 = prvTidyFindBody(doc);
    if (pNVar6 == (Node *)0x0) {
      if (pLVar1->seenEndBody != no) goto LAB_0013aac6;
      prvTidyUngetToken(doc);
      pNVar5 = prvTidyInferredTag(doc,TidyTag_BODY);
      if (*(int *)((doc->config).value + 100) != 0) {
        prvTidyReport(doc,local_70,pNVar5,0x247);
      }
      prvTidyInsertNodeAtEnd(local_70,pNVar5);
    }
    else {
      BVar4 = prvTidynodeIsText(pNVar5);
      if (BVar4 != no) {
        prvTidyUngetToken(doc);
        pNVar5 = prvTidyInferredTag(doc,TidyTag_P);
        prvTidyReport(doc,local_70,pNVar5,0x233);
      }
      pNVar5->parent = pNVar6;
      pNVar3 = pNVar6->last;
      pNVar5->prev = pNVar3;
      ppNVar7 = &pNVar6->content;
      if (pNVar3 != (Node *)0x0) {
        ppNVar7 = &pNVar3->next;
      }
      *ppNVar7 = pNVar5;
      pNVar6->last = pNVar5;
    }
    memory.mode = IgnoreWhitespace;
    memory.register_1 = 0;
    memory.reentry_mode = IgnoreWhitespace;
    memory.reentry_state = 0;
    memory.reentry_node = pNVar5;
  }
  else {
    memory.reentry_mode = IgnoreWhitespace;
    memory.reentry_state = 1;
    memory._32_8_ = (ulong)pLVar1->seenEndBody << 0x20;
    prvTidyInsertNodeAtEnd(local_70,pNVar5);
  }
  data.original_node = local_70;
  data.identity = prvTidyParseNoFrames;
  data.reentry_node = memory.reentry_node;
  data.reentry_mode = memory.reentry_mode;
  data.reentry_state = memory.reentry_state;
  data.mode = memory.mode;
  data.register_1 = memory.register_1;
  data._40_8_ = 0;
  prvTidypushMemory(doc,data);
  return memory.reentry_node;
}

Assistant:

Node* TY_(ParseNoFrames)( TidyDocImpl* doc, Node *noframes, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node = NULL;
    Bool body_seen = no;
    DEBUG_LOG_COUNTERS;

    enum parserState {
        STATE_INITIAL,                /* This is the initial state for every parser. */
        STATE_POST_NODEISBODY,        /* To-do after re-entering after checks. */
        STATE_COMPLETE,               /* Done with the switch. */
    } state = STATE_INITIAL;

    /*
     If we're re-entering, then we need to setup from a previous state,
     instead of starting fresh. We can pull what we need from the document's
     stack.
     */
    if ( noframes == NULL )
    {
        TidyParserMemory memory = TY_(popMemory)( doc );
        node = memory.reentry_node; /* Throwaway, because we replace it entering the loop anyway.*/
        DEBUG_LOG_REENTER_WITH_NODE(node);
        noframes = memory.original_node;
        state = memory.reentry_state;
        body_seen = memory.register_1;
        DEBUG_LOG_GET_OLD_MODE;
        mode = memory.mode;
        DEBUG_LOG_CHANGE_MODE;
    }
    else
    {
        DEBUG_LOG_ENTER_WITH_NODE(noframes);
        if ( cfg(doc, TidyAccessibilityCheckLevel) == 0 )
        {
            doc->badAccess |=  BA_USING_NOFRAMES;
        }
    }

    mode = IgnoreWhitespace;

    while ( state != STATE_COMPLETE )
    {
        if ( state == STATE_INITIAL )
        {
            node = TY_(GetToken)(doc, mode);
            DEBUG_LOG_GOT_TOKEN(node);
        }
        
        switch ( state )
        {
            case STATE_INITIAL:
            {
                if ( node == NULL )
                {
                    state = STATE_COMPLETE;
                    continue;
                }
                
                if ( node->tag == noframes->tag && node->type == EndTag )
                {
                    TY_(FreeNode)( doc, node);
                    noframes->closed = yes;
                    TrimSpaces(doc, noframes);
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if ( nodeIsFRAME(node) || nodeIsFRAMESET(node) )
                {
                    TrimSpaces(doc, noframes);
                    if (node->type == EndTag)
                    {
                        TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                        TY_(FreeNode)( doc, node);       /* Throw it away */
                    }
                    else
                    {
                        TY_(Report)(doc, noframes, node, MISSING_ENDTAG_BEFORE);
                        TY_(UngetToken)( doc );
                    }
                    DEBUG_LOG_EXIT;
                    return NULL;
                }

                if ( nodeIsHTML(node) )
                {
                    if (TY_(nodeIsElement)(node))
                        TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);

                    TY_(FreeNode)( doc, node);
                    continue;
                }

                /* deal with comments etc. */
                if (InsertMisc(noframes, node))
                    continue;

                if ( nodeIsBODY(node) && node->type == StartTag )
                {
                    TidyParserMemory memory = {0};
                    memory.identity = TY_(ParseNoFrames);
                    memory.original_node = noframes;
                    memory.reentry_node = node;
                    memory.reentry_state = STATE_POST_NODEISBODY;
                    memory.register_1 = lexer->seenEndBody;
                    memory.mode = IgnoreWhitespace;

                    TY_(InsertNodeAtEnd)(noframes, node);
                    TY_(pushMemory)( doc, memory );
                    DEBUG_LOG_EXIT_WITH_NODE(node);
                    return node;
                }

                /* implicit body element inferred */
                if (TY_(nodeIsText)(node) || (node->tag && node->type != EndTag))
                {
                    Node *body = TY_(FindBody)( doc );
                    if ( body || lexer->seenEndBody )
                    {
                        if ( body == NULL )
                        {
                            TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                            TY_(FreeNode)( doc, node);
                            continue;
                        }
                        if ( TY_(nodeIsText)(node) )
                        {
                            TY_(UngetToken)( doc );
                            node = TY_(InferredTag)(doc, TidyTag_P);
                            TY_(Report)(doc, noframes, node, CONTENT_AFTER_BODY );
                        }
                        TY_(InsertNodeAtEnd)( body, node );
                    }
                    else
                    {
                        TY_(UngetToken)( doc );
                        node = TY_(InferredTag)(doc, TidyTag_BODY);
                        if ( cfgBool(doc, TidyXmlOut) )
                            TY_(Report)(doc, noframes, node, INSERTING_TAG);
                        TY_(InsertNodeAtEnd)( noframes, node );
                    }

                    {
                        TidyParserMemory memory = {0};
                        memory.identity = TY_(ParseNoFrames);
                        memory.original_node = noframes;
                        memory.reentry_node = node;
                        memory.mode = IgnoreWhitespace; /*MixedContent*/
                        memory.reentry_state = STATE_INITIAL;
                        TY_(pushMemory)( doc, memory );
                        DEBUG_LOG_EXIT_WITH_NODE(node);
                        return node;
                    }
                }

                /* discard unexpected end tags */
                TY_(Report)(doc, noframes, node, DISCARDING_UNEXPECTED);
                TY_(FreeNode)( doc, node);
            } break;
                
                
            case STATE_POST_NODEISBODY:
            {
                /* fix for bug http://tidy.sf.net/bug/887259 */
                if (body_seen && TY_(FindBody)(doc) != node)
                {
                    TY_(CoerceNode)(doc, node, TidyTag_DIV, no, no);
                    MoveNodeToBody(doc, node);
                }
                state = STATE_INITIAL;
                continue;

            } break;
                
                
            default:
                break;
        } /* switch */
    } /* while */

    TY_(Report)(doc, noframes, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}